

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void op_addr_block_post(DisasContext_conflict1 *s,arg_ldst_block *a,TCGv_i32 addr,int n)

{
  TCGContext_conflict1 *tcg_ctx_00;
  TCGContext_conflict1 *tcg_ctx;
  int n_local;
  TCGv_i32 addr_local;
  arg_ldst_block *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if (a->w == 0) {
    tcg_temp_free_i32(tcg_ctx_00,addr);
  }
  else {
    if (a->b == 0) {
      if (a->i == 0) {
        tcg_gen_addi_i32_aarch64(tcg_ctx_00,addr,addr,n * -4);
      }
      else {
        tcg_gen_addi_i32_aarch64(tcg_ctx_00,addr,addr,4);
      }
    }
    else if ((a->i == 0) && (n != 1)) {
      tcg_gen_addi_i32_aarch64(tcg_ctx_00,addr,addr,(n + -1) * -4);
    }
    store_reg(s,a->rn,addr);
  }
  return;
}

Assistant:

static void op_addr_block_post(DisasContext *s, arg_ldst_block *a,
                               TCGv_i32 addr, int n)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (a->w) {
        /* write back */
        if (!a->b) {
            if (a->i) {
                /* post increment */
                tcg_gen_addi_i32(tcg_ctx, addr, addr, 4);
            } else {
                /* post decrement */
                tcg_gen_addi_i32(tcg_ctx, addr, addr, -(n * 4));
            }
        } else if (!a->i && n != 1) {
            /* pre decrement */
            tcg_gen_addi_i32(tcg_ctx, addr, addr, -((n - 1) * 4));
        }
        store_reg(s, a->rn, addr);
    } else {
        tcg_temp_free_i32(tcg_ctx, addr);
    }
}